

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O0

RelatedFullDocumentDiagnosticReport *
my_lsp_server::lscpp_handle_diagnostic_report
          (RelatedFullDocumentDiagnosticReport *__return_storage_ptr__,server *param_1,
          DocumentDiagnosticParams *param_2)

{
  initializer_list<lscpp::protocol::Diagnostic> __l;
  Diagnostic *local_158;
  allocator<lscpp::protocol::Diagnostic> local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  allocator<char> local_ed;
  DiagnosticSeverity local_ec;
  Diagnostic *local_e8;
  Diagnostic local_e0;
  undefined1 local_30 [24];
  DocumentDiagnosticParams *param_1_local;
  server *param_0_local;
  
  local_30._16_8_ = param_2;
  param_1_local = (DocumentDiagnosticParams *)param_1;
  param_0_local = (server *)__return_storage_ptr__;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_char_(&)[4],_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__return_storage_ptr__,(char (*) [4])"foo");
  local_ff = 1;
  local_e8 = &local_e0;
  local_e0.range.start.line = 2;
  local_e0.range.start.character = 1;
  local_e0.range.end.line = 2;
  local_e0.range.end.character = 5;
  local_ec = Error;
  std::optional<lscpp::protocol::DiagnosticSeverity>::
  optional<lscpp::protocol::DiagnosticSeverity,_true>(&local_e0.severity,&local_ec);
  std::
  optional<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::optional(&local_e0.code);
  local_fe = 1;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_e0.source);
  local_fd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0.message,"Oh that\'s stupid!",&local_ed);
  std::
  optional<std::vector<lscpp::protocol::DiagnosticTag,_std::allocator<lscpp::protocol::DiagnosticTag>_>_>
  ::optional(&local_e0.tags);
  local_fd = 0;
  local_fe = 0;
  local_ff = 0;
  local_30._0_8_ = &local_e0;
  local_30._8_4_ = 1;
  local_30._12_4_ = 0;
  std::allocator<lscpp::protocol::Diagnostic>::allocator(&local_100);
  __l._M_len = local_30._8_8_;
  __l._M_array = (iterator)local_30._0_8_;
  std::vector<lscpp::protocol::Diagnostic,_std::allocator<lscpp::protocol::Diagnostic>_>::vector
            (&(__return_storage_ptr__->super_FullDocumentDiagnosticReport).items,__l,&local_100);
  std::allocator<lscpp::protocol::Diagnostic>::~allocator(&local_100);
  local_158 = (Diagnostic *)local_30;
  do {
    local_158 = local_158 + -1;
    lscpp::protocol::Diagnostic::~Diagnostic(local_158);
  } while (local_158 != &local_e0);
  std::allocator<char>::~allocator(&local_ed);
  return __return_storage_ptr__;
}

Assistant:

lscpp::protocol::RelatedFullDocumentDiagnosticReport
  lscpp_handle_diagnostic_report(server &,
                                 lscpp::protocol::DocumentDiagnosticParams) {
    return {{"foo",
             {lscpp::protocol::Diagnostic{
                 lscpp::protocol::Range{{2, 1}, {2, 5}},
                 lscpp::protocol::DiagnosticSeverity::Error,
                 {},
                 {},
                 "Oh that's stupid!"}}}};
  }